

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getRangingInterface(Highs *this)

{
  HighsStatus HVar1;
  HighsLpSolverObject local_50;
  
  local_50.lp_ = &(this->model_).lp_;
  local_50.basis_ = &this->basis_;
  local_50.solution_ = &this->solution_;
  local_50.highs_info_ = &this->info_;
  local_50.ekk_instance_ = &this->ekk_instance_;
  local_50.callback_ = &this->callback_;
  local_50.options_ = &this->options_;
  local_50.timer_ = &this->timer_;
  local_50.model_status_ = this->model_status_;
  HVar1 = getRangingData(&this->ranging_,&local_50);
  return HVar1;
}

Assistant:

HighsStatus Highs::getRangingInterface() {
  HighsLpSolverObject solver_object(model_.lp_, basis_, solution_, info_,
                                    ekk_instance_, callback_, options_, timer_);
  solver_object.model_status_ = model_status_;
  return getRangingData(this->ranging_, solver_object);
}